

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O1

void aom_hadamard_lp_16x16_c(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [12];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  undefined1 auVar13 [12];
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [12];
  uint uVar19;
  int16_t *piVar20;
  long lVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  int iVar25;
  int iVar29;
  int iVar30;
  undefined1 in_XMM1 [16];
  undefined1 auVar26 [16];
  int iVar31;
  undefined1 auVar28 [16];
  short sVar32;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  undefined1 auVar33 [16];
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  undefined2 uVar49;
  short sVar50;
  undefined2 uVar51;
  short sVar52;
  undefined2 uVar53;
  short sVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [12];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 auVar27 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  
  lVar21 = 0;
  uVar19 = 0;
  piVar20 = coeff;
  do {
    aom_hadamard_lp_8x8_c
              (src_diff + (ulong)((uint)lVar21 & 8) * src_stride + (ulong)(uVar19 & 8),src_stride,
               piVar20);
    piVar20 = piVar20 + 0x40;
    uVar19 = uVar19 + 8;
    lVar21 = lVar21 + 4;
  } while (lVar21 != 0x10);
  lVar21 = -0x40;
  do {
    auVar55 = *(undefined1 (*) [16])(coeff + lVar21 + 0x40);
    auVar1 = *(undefined1 (*) [16])(coeff + lVar21 + 0x80);
    auVar2 = *(undefined1 (*) [16])(coeff + lVar21 + 0xc0);
    auVar28 = *(undefined1 (*) [16])(coeff + lVar21 + 0x100);
    auVar33._0_12_ = in_XMM1._0_12_;
    auVar33._12_2_ = in_XMM1._6_2_;
    auVar33._14_2_ = auVar55._6_2_;
    auVar27._12_4_ = auVar33._12_4_;
    auVar27._0_10_ = in_XMM1._0_10_;
    auVar27._10_2_ = auVar55._4_2_;
    auVar26._10_6_ = auVar27._10_6_;
    auVar26._0_8_ = in_XMM1._0_8_;
    auVar26._8_2_ = in_XMM1._4_2_;
    auVar18._4_8_ = auVar26._8_8_;
    auVar18._2_2_ = auVar55._2_2_;
    auVar18._0_2_ = in_XMM1._2_2_;
    sVar22 = auVar28._10_2_;
    auVar58._0_4_ = (int)auVar28._8_2_;
    auVar57._0_8_ = CONCAT44((int)sVar22,auVar58._0_4_);
    auVar57._8_4_ = (int)auVar28._12_2_;
    iVar9 = (int)auVar2._10_2_ - (int)sVar22;
    iVar10 = auVar2._12_2_ - auVar57._8_4_;
    iVar11 = (int)auVar2._14_2_ - (int)auVar28._14_2_;
    auVar61._12_2_ = sVar22 >> 0xf;
    auVar61._0_12_ = auVar57;
    auVar61._14_2_ = auVar28._6_2_;
    auVar60._12_4_ = auVar61._12_4_;
    auVar60._0_10_ = auVar57._0_10_;
    auVar60._10_2_ = auVar28._4_2_;
    auVar59._10_6_ = auVar60._10_6_;
    auVar59._8_2_ = sVar22;
    auVar59._0_8_ = auVar57._0_8_;
    auVar58._8_8_ = auVar59._8_8_;
    auVar58._6_2_ = auVar28._2_2_;
    auVar58._4_2_ = auVar28._8_2_ >> 0xf;
    iVar15 = (int)auVar2._2_2_ - (auVar58._4_4_ >> 0x10);
    iVar16 = (int)auVar2._4_2_ - (auVar59._8_4_ >> 0x10);
    iVar17 = (int)auVar2._6_2_ - (auVar60._12_4_ >> 0x10);
    auVar62 = auVar1 & auVar55;
    auVar33 = psraw(auVar1 ^ auVar55,1);
    sVar32 = auVar33._0_2_ + auVar62._0_2_;
    sVar34 = auVar33._2_2_ + auVar62._2_2_;
    sVar35 = auVar33._4_2_ + auVar62._4_2_;
    sVar36 = auVar33._6_2_ + auVar62._6_2_;
    sVar37 = auVar33._8_2_ + auVar62._8_2_;
    sVar38 = auVar33._10_2_ + auVar62._10_2_;
    sVar39 = auVar33._12_2_ + auVar62._12_2_;
    sVar40 = auVar33._14_2_ + auVar62._14_2_;
    auVar62 = auVar28 & auVar2;
    auVar33 = psraw(auVar28 ^ auVar2,1);
    sVar41 = auVar33._0_2_ + auVar62._0_2_;
    sVar42 = auVar33._2_2_ + auVar62._2_2_;
    sVar43 = auVar33._4_2_ + auVar62._4_2_;
    sVar44 = auVar33._6_2_ + auVar62._6_2_;
    sVar45 = auVar33._8_2_ + auVar62._8_2_;
    sVar46 = auVar33._10_2_ + auVar62._10_2_;
    sVar47 = auVar33._12_2_ + auVar62._12_2_;
    sVar48 = auVar33._14_2_ + auVar62._14_2_;
    piVar20 = coeff + lVar21 + 0x40;
    *piVar20 = sVar41 + sVar32;
    piVar20[1] = sVar42 + sVar34;
    piVar20[2] = sVar43 + sVar35;
    piVar20[3] = sVar44 + sVar36;
    piVar20[4] = sVar45 + sVar37;
    piVar20[5] = sVar46 + sVar38;
    piVar20[6] = sVar47 + sVar39;
    piVar20[7] = sVar48 + sVar40;
    uVar19 = (int)auVar55._8_2_ - (int)auVar1._8_2_ >> 1;
    uVar3 = (int)auVar55._10_2_ - (int)auVar1._10_2_ >> 1;
    uVar4 = (int)auVar55._12_2_ - (int)auVar1._12_2_ >> 1;
    uVar5 = (int)auVar55._14_2_ - (int)auVar1._14_2_ >> 1;
    iVar25 = (int)auVar55._0_2_ - (int)auVar1._0_2_ >> 1;
    iVar29 = (auVar18._0_4_ >> 0x10) - (int)auVar1._2_2_ >> 1;
    iVar30 = (auVar26._8_4_ >> 0x10) - (int)auVar1._4_2_ >> 1;
    iVar31 = (auVar27._12_4_ >> 0x10) - (int)auVar1._6_2_ >> 1;
    iVar8 = auVar2._8_2_ - auVar58._0_4_ >> 1;
    sVar22 = (short)(iVar9 >> 1);
    sVar23 = (short)(iVar10 >> 1);
    sVar24 = (short)(iVar11 >> 1);
    uVar14 = (int)auVar2._0_2_ - (int)auVar28._0_2_ >> 1;
    uVar49 = (undefined2)(iVar15 >> 1);
    sVar50 = (short)(iVar15 >> 0x11);
    uVar51 = (undefined2)(iVar16 >> 1);
    sVar52 = (short)(iVar16 >> 0x11);
    uVar53 = (undefined2)(iVar17 >> 1);
    sVar54 = (short)(iVar17 >> 0x11);
    uVar12 = CONCAT26(sVar50,CONCAT24(uVar49,uVar14)) & 0xffffffff0000ffff;
    auVar13._8_2_ = uVar51;
    auVar13._0_8_ = uVar12;
    auVar13._10_2_ = sVar52;
    auVar2._12_2_ = uVar53;
    auVar2._0_12_ = auVar13;
    auVar2._14_2_ = sVar54;
    uVar6 = CONCAT26((short)(iVar9 >> 0x11),CONCAT24(sVar22,iVar8)) & 0xffffffff0000ffff;
    auVar7._8_2_ = sVar23;
    auVar7._0_8_ = uVar6;
    auVar7._10_2_ = (short)(iVar10 >> 0x11);
    auVar1._12_2_ = sVar24;
    auVar1._0_12_ = auVar7;
    auVar1._14_2_ = (short)(iVar11 >> 0x11);
    auVar56._0_4_ = (int)(((int)uVar6 + (uVar19 & 0xffff)) * 0x10000) >> 0x10;
    auVar56._4_4_ = (int)(((int)(uVar6 >> 0x20) + (uVar3 & 0xffff)) * 0x10000) >> 0x10;
    auVar56._8_4_ = (int)((auVar7._8_4_ + (uVar4 & 0xffff)) * 0x10000) >> 0x10;
    auVar56._12_4_ = (int)((auVar1._12_4_ + (uVar5 & 0xffff)) * 0x10000) >> 0x10;
    auVar62._0_4_ = (int)(((uVar14 & 0xffff) + iVar25) * 0x10000) >> 0x10;
    auVar62._4_4_ = ((int)(uVar12 >> 0x20) + iVar29) * 0x10000 >> 0x10;
    auVar62._8_4_ = (auVar13._8_4_ + iVar30) * 0x10000 >> 0x10;
    auVar62._12_4_ = (auVar2._12_4_ + iVar31) * 0x10000 >> 0x10;
    auVar55 = packssdw(auVar62,auVar56);
    *(undefined1 (*) [16])(coeff + lVar21 + 0x80) = auVar55;
    piVar20 = coeff + lVar21 + 0xc0;
    *piVar20 = sVar32 - sVar41;
    piVar20[1] = sVar34 - sVar42;
    piVar20[2] = sVar35 - sVar43;
    piVar20[3] = sVar36 - sVar44;
    piVar20[4] = sVar37 - sVar45;
    piVar20[5] = sVar38 - sVar46;
    piVar20[6] = sVar39 - sVar47;
    piVar20[7] = sVar40 - sVar48;
    sVar22 = (short)uVar3 - sVar22;
    sVar23 = (short)uVar4 - sVar23;
    sVar24 = (short)uVar5 - sVar24;
    auVar28._0_4_ = (int)((iVar25 - (uVar14 & 0xffff)) * 0x10000) >> 0x10;
    auVar28._4_4_ = (iVar29 - CONCAT22(sVar50,uVar49)) * 0x10000 >> 0x10;
    auVar28._8_4_ = (iVar30 - CONCAT22(sVar52,uVar51)) * 0x10000 >> 0x10;
    auVar28._12_4_ = (iVar31 - CONCAT22(sVar54,uVar53)) * 0x10000 >> 0x10;
    auVar55._4_2_ = sVar22;
    auVar55._0_4_ = (int)(short)((short)uVar19 - (short)iVar8);
    auVar55._6_2_ = sVar22 >> 0xf;
    auVar55._8_2_ = sVar23;
    auVar55._10_2_ = sVar23 >> 0xf;
    auVar55._12_2_ = sVar24;
    auVar55._14_2_ = sVar24 >> 0xf;
    in_XMM1 = packssdw(auVar28,auVar55);
    *(undefined1 (*) [16])(coeff + lVar21 + 0x100) = in_XMM1;
    lVar21 = lVar21 + 8;
  } while (lVar21 != 0);
  return;
}

Assistant:

void aom_hadamard_lp_16x16_c(const int16_t *src_diff, ptrdiff_t src_stride,
                             int16_t *coeff) {
  for (int idx = 0; idx < 4; ++idx) {
    // src_diff: 9 bit, dynamic range [-255, 255]
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    aom_hadamard_lp_8x8_c(src_ptr, src_stride, coeff + idx * 64);
  }

  for (int idx = 0; idx < 64; ++idx) {
    int16_t a0 = coeff[0];
    int16_t a1 = coeff[64];
    int16_t a2 = coeff[128];
    int16_t a3 = coeff[192];

    int16_t b0 = (a0 + a1) >> 1;  // (a0 + a1): 16 bit, [-32640, 32640]
    int16_t b1 = (a0 - a1) >> 1;  // b0-b3: 15 bit, dynamic range
    int16_t b2 = (a2 + a3) >> 1;  // [-16320, 16320]
    int16_t b3 = (a2 - a3) >> 1;

    coeff[0] = b0 + b2;  // 16 bit, [-32640, 32640]
    coeff[64] = b1 + b3;
    coeff[128] = b0 - b2;
    coeff[192] = b1 - b3;

    ++coeff;
  }
}